

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O3

FT_Error tt_face_load_fpgm(TT_Face face,FT_Stream stream)

{
  FT_Error FVar1;
  FT_ULong local_20;
  FT_ULong table_len;
  
  FVar1 = (*face->goto_table)(face,0x6670676d,stream,&local_20);
  if (FVar1 == 0) {
    face->font_program_size = local_20;
    FVar1 = FT_Stream_ExtractFrame(stream,local_20,&face->font_program);
  }
  else {
    face->font_program_size = 0;
    face->font_program = (FT_Byte *)0x0;
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_fpgm( TT_Face    face,
                     FT_Stream  stream )
  {
#ifdef TT_USE_BYTECODE_INTERPRETER

    FT_Error  error;
    FT_ULong  table_len;


    FT_TRACE2(( "Font program " ));

    /* The font program is optional */
    error = face->goto_table( face, TTAG_fpgm, stream, &table_len );
    if ( error )
    {
      face->font_program      = NULL;
      face->font_program_size = 0;
      error                   = FT_Err_Ok;

      FT_TRACE2(( "is missing\n" ));
    }
    else
    {
      face->font_program_size = table_len;
      if ( FT_FRAME_EXTRACT( table_len, face->font_program ) )
        goto Exit;

      FT_TRACE2(( "loaded, %12d bytes\n", face->font_program_size ));
    }

  Exit:
    return error;

#else /* !TT_USE_BYTECODE_INTERPRETER */

    FT_UNUSED( face   );
    FT_UNUSED( stream );

    return FT_Err_Ok;

#endif
  }